

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O3

void Js::AsmJsByteCodeDumper::
     DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint i;
  long lVar1;
  
  lVar1 = 0;
  Output::Print(L" F4_%d ",(ulong)data->R0);
  Output::Print(L" F4_%d ",(ulong)data->R1);
  Output::Print(L" F4_%d ",(ulong)data->R2);
  do {
    ByteCodeDumper::DumpU4((uint)data->INDICES[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmShuffle(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpFloat32x4Reg(data->R0);
        DumpFloat32x4Reg(data->R1);
        DumpFloat32x4Reg(data->R2);
        const uint NUM_LANES = 16;
        for (uint i = 0; i < NUM_LANES; i++)
        {
            DumpU4(data->INDICES[i]);
        }
    }